

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  size_t sVar1;
  value_type local_30;
  char *out;
  char *pcStack_20;
  int len_local;
  char *str_local;
  ParserType *pt_local;
  cmCommandArgumentParserHelper *this_local;
  
  pt->str = (char *)0x0;
  out._4_4_ = len;
  pcStack_20 = str;
  str_local = (char *)pt;
  pt_local = (ParserType *)this;
  if (len == 0) {
    sVar1 = strlen(str);
    out._4_4_ = (int)sVar1;
  }
  if (out._4_4_ != 0) {
    local_30 = (value_type)operator_new__((long)(out._4_4_ + 1));
    memcpy(local_30,pcStack_20,(long)out._4_4_);
    local_30[out._4_4_] = '\0';
    *(value_type *)str_local = local_30;
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->Variables,&local_30);
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType(
  cmCommandArgumentParserHelper::ParserType* pt, const char* str, int len)
{
  pt->str = nullptr;
  if (len == 0) {
    len = static_cast<int>(strlen(str));
  }
  if (len == 0) {
    return;
  }
  char* out = new char[len + 1];
  memcpy(out, str, len);
  out[len] = 0;
  pt->str = out;
  this->Variables.push_back(out);
}